

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::OptionalFilter::ToString
          (string *__return_storage_ptr__,OptionalFilter *this,string *column_name)

{
  pointer pTVar1;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"optional: ",&local_59);
  pTVar1 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->(&this->child_filter);
  (*pTVar1->_vptr_TableFilter[3])(&local_58,pTVar1,column_name);
  ::std::operator+(__return_storage_ptr__,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string OptionalFilter::ToString(const string &column_name) const {
	return string("optional: ") + child_filter->ToString(column_name);
}